

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

QPoint __thiscall
QIconModeViewBase::initDynamicLayout(QIconModeViewBase *this,QListViewLayoutInfo *info)

{
  uint uVar1;
  QListViewItem *pQVar2;
  Data *pDVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  
  iVar6 = info->first;
  if (iVar6 == 0) {
    uVar9 = (info->bounds).x1.m_i + info->spacing;
    uVar13 = (ulong)(uint)(info->spacing + (info->bounds).y1.m_i);
    iVar6 = QCommonListViewBase::rowCount(&this->super_QCommonListViewBase);
    pDVar3 = (((this->super_QCommonListViewBase).dd)->hiddenRows).q_hash.d;
    if (pDVar3 == (Data *)0x0) {
      iVar10 = 0;
    }
    else {
      iVar10 = (int)pDVar3->size;
    }
    QList<QListViewItem>::reserve(&this->items,(long)(iVar6 - iVar10));
  }
  else {
    iVar10 = iVar6 + 1;
    lVar11 = (ulong)(iVar6 - 1U) * 0x14;
    lVar4 = (long)(int)(iVar6 - 1U) * 0x14;
    do {
      lVar12 = lVar4;
      iVar10 = iVar10 + -1;
      if (iVar10 < 2) break;
      bVar5 = QListViewItem::isValid((QListViewItem *)((long)&((this->items).d.ptr)->x + lVar11));
      lVar11 = lVar11 + -0x14;
      lVar4 = lVar12 + -0x14;
    } while (!bVar5);
    pQVar2 = (this->items).d.ptr;
    uVar9 = *(uint *)((long)&pQVar2->x + lVar12);
    uVar1 = *(uint *)((long)&pQVar2->y + lVar12);
    uVar13 = (ulong)uVar1;
    uVar8 = (info->grid).wd.m_i;
    uVar7 = (info->grid).ht.m_i;
    bVar5 = (int)(uVar8 | uVar7) < 0;
    if (info->flow == LeftToRight) {
      if (bVar5) {
        uVar8 = (uint)*(short *)((long)&pQVar2->w + lVar12);
      }
      uVar9 = uVar8 + uVar9 + info->spacing;
    }
    else {
      if (bVar5) {
        uVar7 = (uint)*(short *)((long)&pQVar2->h + lVar12);
      }
      uVar13 = (ulong)(uVar7 + uVar1 + info->spacing);
    }
  }
  return (QPoint)((ulong)uVar9 | uVar13 << 0x20);
}

Assistant:

QPoint QIconModeViewBase::initDynamicLayout(const QListViewLayoutInfo &info)
{
    int x, y;
    if (info.first == 0) {
        x = info.bounds.x() + info.spacing;
        y = info.bounds.y() + info.spacing;
        items.reserve(rowCount() - hiddenCount());
    } else {
        int idx = info.first - 1;
        while (idx > 0 && !items.at(idx).isValid())
            --idx;
        const QListViewItem &item = items.at(idx);
        x = item.x;
        y = item.y;
        if (info.flow == QListView::LeftToRight)
            x += (info.grid.isValid() ? info.grid.width() : item.w) + info.spacing;
        else
            y += (info.grid.isValid() ? info.grid.height() : item.h) + info.spacing;
    }
    return QPoint(x, y);
}